

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *pXVar1;
  undefined4 in_register_00000034;
  XmlOutput *this_00;
  long in_FS_OFFSET;
  xml_output local_3d0;
  xml_output local_398;
  xml_output local_360;
  xml_output local_328;
  xml_output local_2f0;
  xml_output local_2b8;
  xml_output local_280;
  xml_output local_248;
  xml_output local_210;
  xml_output local_1d8;
  xml_output local_1a0;
  xml_output local_168;
  xml_output local_130;
  xml_output local_f8;
  xml_output local_c0;
  QArrayDataPointer<char16_t> local_88;
  xml_output local_70;
  long local_38;
  
  this_00 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_88,"Configuration");
  tag(&local_70,(QString *)&local_88);
  pXVar1 = XmlOutput::operator<<(this_00,&local_70);
  attrS(&local_c0,"Name",(QString *)((long)__buf + 0x60));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_c0);
  attrS(&local_f8,"OutputDirectory",(QString *)((long)__buf + 0x90));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_f8);
  attrT(&local_130,"ATLMinimizesCRunTimeLibraryUsage",*(triState *)((long)__buf + 8));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_130);
  attrT(&local_168,"BuildBrowserInformation",*(triState *)((long)__buf + 0xc));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_168);
  attrE(&local_1a0,"CharacterSet",*(int *)((long)__buf + 0x10),0);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_1a0);
  attrE(&local_1d8,"ConfigurationType",*(int *)((long)__buf + 0x14));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_1d8);
  attrS(&local_210,"DeleteExtensionsOnClean",(QString *)((long)__buf + 0x18));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_210);
  attrS(&local_248,"ImportLibrary",(QString *)((long)__buf + 0x30));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_248);
  attrS(&local_280,"IntermediateDirectory",(QString *)((long)__buf + 0x48));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_280);
  attrS(&local_2b8,"PrimaryOutput",(QString *)((long)__buf + 0xa8));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_2b8);
  attrS(&local_2f0,"ProgramDatabase",(QString *)((long)__buf + 0xd8));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_2f0);
  attrT(&local_328,"RegisterOutput",*(triState *)((long)__buf + 0x108));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_328);
  attrE(&local_360,"UseOfATL",*(int *)((long)__buf + 0x10c),0);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_360);
  attrE(&local_398,"UseOfMfc",*(int *)((long)__buf + 0x110));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_398);
  attrT(&local_3d0,"WholeProgramOptimization",*(triState *)((long)__buf + 0x114));
  XmlOutput::operator<<(pXVar1,&local_3d0);
  XmlOutput::xml_output::~xml_output(&local_3d0);
  XmlOutput::xml_output::~xml_output(&local_398);
  XmlOutput::xml_output::~xml_output(&local_360);
  XmlOutput::xml_output::~xml_output(&local_328);
  XmlOutput::xml_output::~xml_output(&local_2f0);
  XmlOutput::xml_output::~xml_output(&local_2b8);
  XmlOutput::xml_output::~xml_output(&local_280);
  XmlOutput::xml_output::~xml_output(&local_248);
  XmlOutput::xml_output::~xml_output(&local_210);
  XmlOutput::xml_output::~xml_output(&local_1d8);
  XmlOutput::xml_output::~xml_output(&local_1a0);
  XmlOutput::xml_output::~xml_output(&local_168);
  XmlOutput::xml_output::~xml_output(&local_130);
  XmlOutput::xml_output::~xml_output(&local_f8);
  XmlOutput::xml_output::~xml_output(&local_c0);
  XmlOutput::xml_output::~xml_output(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  (*this->_vptr_VCProjectWriter[4])(this,this_00,(long)__buf + 0x118);
  if (*(int *)((long)__buf + 0x14) == 4) {
    (*this->_vptr_VCProjectWriter[9])(this,this_00,(long)__buf + 0x868);
  }
  else {
    (*this->_vptr_VCProjectWriter[5])(this,this_00,(long)__buf + 0x438);
  }
  (*this->_vptr_VCProjectWriter[6])(this,this_00,(long)__buf + 0x940);
  (*this->_vptr_VCProjectWriter[7])(this,this_00,(long)__buf + 0x950);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xb78);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xc00);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xcd8);
  (*this->_vptr_VCProjectWriter[10])(this,this_00,(long)__buf + 0xd60);
  (*this->_vptr_VCProjectWriter[0xc])(this,this_00,(long)__buf + 0xc88);
  QString::QString((QString *)&local_c0,"Configuration");
  closetag(&local_70,(QString *)&local_c0);
  XmlOutput::operator<<(this_00,&local_70);
  XmlOutput::xml_output::~xml_output(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCConfiguration &tool)
{
    xml << tag(_Configuration)
            << attrS(_Name, tool.Name)
            << attrS(_OutputDirectory, tool.OutputDirectory)
            << attrT(_ATLMinimizesCRunTimeLibraryUsage, tool.ATLMinimizesCRunTimeLibraryUsage)
            << attrT(_BuildBrowserInformation, tool.BuildBrowserInformation)
            << attrE(_CharacterSet, tool.CharacterSet, /*ifNot*/ charSetNotSet)
            << attrE(_ConfigurationType, tool.ConfigurationType)
            << attrS(_DeleteExtensionsOnClean, tool.DeleteExtensionsOnClean)
            << attrS(_ImportLibrary, tool.ImportLibrary)
            << attrS(_IntermediateDirectory, tool.IntermediateDirectory)
            << attrS(_PrimaryOutput, tool.PrimaryOutput)
            << attrS(_ProgramDatabase, tool.ProgramDatabase)
            << attrT(_RegisterOutput, tool.RegisterOutput)
            << attrE(_UseOfATL, tool.UseOfATL, /*ifNot*/ useATLNotSet)
            << attrE(_UseOfMfc, tool.UseOfMfc)
            << attrT(_WholeProgramOptimization, tool.WholeProgramOptimization);
    write(xml, tool.compiler);
    if (tool.ConfigurationType == typeStaticLibrary)
        write(xml, tool.librarian);
    else
        write(xml, tool.linker);
    write(xml, tool.manifestTool);
    write(xml, tool.idl);
    write(xml, tool.postBuild);
    write(xml, tool.preBuild);
    write(xml, tool.preLink);
    write(xml, tool.resource);
    write(xml, tool.deployment);
    xml << closetag(_Configuration);
}